

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O2

void __thiscall
VW::vw_exception::vw_exception(vw_exception *this,char *pfile,int plineNumber,string *pmessage)

{
  *(undefined ***)this = &PTR__vw_exception_002a5f38;
  this->file = pfile;
  std::__cxx11::string::string((string *)&this->message,(string *)pmessage);
  this->lineNumber = plineNumber;
  return;
}

Assistant:

vw_exception::vw_exception(const char* pfile, int plineNumber, std::string pmessage)
    : file(pfile), message(pmessage), lineNumber(plineNumber)
{
}